

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessible.cpp
# Opt level: O1

QString * __thiscall
QAccessibleTextInterface::textBeforeOffset
          (QString *__return_storage_ptr__,QAccessibleTextInterface *this,int offset,
          TextBoundaryType boundaryType,int *startOffset,int *endOffset)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long in_FS_OFFSET;
  QTextBoundaryFinder boundary;
  undefined1 *local_a8;
  Data *pDStack_a0;
  char16_t *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  storage_type_conflict *psStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  QCharAttributes *local_68;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d._0_4_ = 0xaaaaaaaa;
  local_58.d.d._4_4_ = 0xaaaaaaaa;
  local_58.d.ptr._0_4_ = 0xaaaaaaaa;
  local_58.d.ptr._4_4_ = 0xaaaaaaaa;
  uVar2 = (*this->_vptr_QAccessibleTextInterface[0xd])(this);
  (*this->_vptr_QAccessibleTextInterface[9])(&local_58,this,0,(ulong)uVar2);
  if (offset == -1) {
    offset = (uint)local_58.d.size;
  }
  *endOffset = -1;
  *startOffset = -1;
  if ((0 < offset && (undefined1 *)local_58.d.size != (undefined1 *)0x0) &&
     ((undefined1 *)(ulong)(uint)offset <= (ulong)local_58.d.size)) {
    if (boundaryType < ParagraphBoundary) {
      local_68 = (QCharAttributes *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      psStack_80 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
      local_98 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      pDStack_a0 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QTextBoundaryFinder::QTextBoundaryFinder
                ((QTextBoundaryFinder *)&local_a8,boundaryType,&local_58);
      QTextBoundaryFinder::setPosition((longlong)&local_a8);
      do {
        uVar4 = QTextBoundaryFinder::boundaryReasons();
        if ((uVar4 & 0x60) != 0) break;
        lVar5 = QTextBoundaryFinder::toPreviousBoundary();
      } while (0 < lVar5);
      iVar3 = QTextBoundaryFinder::position();
      *endOffset = iVar3;
      do {
        lVar5 = QTextBoundaryFinder::toPreviousBoundary();
        if (lVar5 < 1) break;
        uVar4 = QTextBoundaryFinder::boundaryReasons();
      } while ((uVar4 & 0x60) == 0);
      iVar3 = QTextBoundaryFinder::position();
      *startOffset = iVar3;
      QString::mid((longlong)__return_storage_ptr__,(longlong)&local_58);
      QTextBoundaryFinder::~QTextBoundaryFinder((QTextBoundaryFinder *)&local_a8);
      goto LAB_0058f505;
    }
    if (boundaryType - ParagraphBoundary < 2) {
      textLineBoundary(__return_storage_ptr__,-1,&local_58,offset,startOffset,endOffset);
      goto LAB_0058f505;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_0058f505:
  piVar1 = (int *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_),2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QAccessibleTextInterface::textBeforeOffset(int offset, QAccessible::TextBoundaryType boundaryType,
                                                   int *startOffset, int *endOffset) const
{
    const QString txt = text(0, characterCount());

    if (offset == -1)
        offset = txt.size();

    *startOffset = *endOffset = -1;
    if (txt.isEmpty() || offset <= 0 || offset > txt.size())
        return QString();

    // type initialized just to silence a compiler warning [-Werror=maybe-uninitialized]
    QTextBoundaryFinder::BoundaryType type = QTextBoundaryFinder::Grapheme;
    switch (boundaryType) {
    case QAccessible::CharBoundary:
        type = QTextBoundaryFinder::Grapheme;
        break;
    case QAccessible::WordBoundary:
        type = QTextBoundaryFinder::Word;
        break;
    case QAccessible::SentenceBoundary:
        type = QTextBoundaryFinder::Sentence;
        break;
    case QAccessible::LineBoundary:
    case QAccessible::ParagraphBoundary:
        // Lines can not use QTextBoundaryFinder since Line there means any potential line-break.
        return textLineBoundary(-1, txt, offset, startOffset, endOffset);
    case QAccessible::NoBoundary:
        // return empty, this function currently only supports single lines, so there can be no line before
        return QString();
    default:
        Q_UNREACHABLE();
    }

    // keep behavior in sync with QTextCursor::movePosition()!

    QTextBoundaryFinder boundary(type, txt);
    boundary.setPosition(offset);

    do {
        if ((boundary.boundaryReasons() & (QTextBoundaryFinder::StartOfItem | QTextBoundaryFinder::EndOfItem)))
            break;
    } while (boundary.toPreviousBoundary() > 0);
    Q_ASSERT(boundary.position() >= 0);
    *endOffset = boundary.position();

    while (boundary.toPreviousBoundary() > 0) {
        if ((boundary.boundaryReasons() & (QTextBoundaryFinder::StartOfItem | QTextBoundaryFinder::EndOfItem)))
            break;
    }
    Q_ASSERT(boundary.position() >= 0);
    *startOffset = boundary.position();

    return txt.mid(*startOffset, *endOffset - *startOffset);
}